

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgExoticQuadrature.hpp
# Opt level: O0

CustomTabulated *
TasGrid::getShiftedExoticQuadrature
          (CustomTabulated *__return_storage_ptr__,int n,double shift,
          vector<double,_std::allocator<double>_> *shifted_weights,
          vector<double,_std::allocator<double>_> *ref_points,char *description,bool is_symmetric)

{
  pointer *this;
  allocator<int> *this_00;
  double dVar1;
  bool bVar2;
  int iVar3;
  size_type sVar4;
  size_type sVar5;
  pointer piVar6;
  reference pdVar7;
  reference pvVar8;
  reference pvVar9;
  reference pvVar10;
  double extraout_XMM0_Qa;
  allocator<char> local_151;
  string local_150;
  int local_130;
  allocator<int> local_129;
  int i_1;
  vector<int,_std::allocator<int>_> precision;
  undefined1 local_108 [8];
  vector<int,_std::allocator<int>_> num_nodes;
  size_t k;
  longlong nonunique_idx;
  size_t j;
  double *w;
  iterator __end3;
  iterator __begin3;
  vector<double,_std::allocator<double>_> *__range3;
  vector<double,_std::allocator<double>_> correction_weights;
  vector<double,_std::allocator<double>_> correction_points;
  size_t init_size;
  int i;
  undefined1 local_70 [8];
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  weights_cache;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  points_cache;
  bool is_symmetric_local;
  char *description_local;
  vector<double,_std::allocator<double>_> *ref_points_local;
  vector<double,_std::allocator<double>_> *shifted_weights_local;
  double shift_local;
  int n_local;
  
  sVar4 = std::vector<double,_std::allocator<double>_>::size(shifted_weights);
  sVar5 = std::vector<double,_std::allocator<double>_>::size(ref_points);
  if (sVar4 != sVar5) {
    __assert_fail("shifted_weights.size() == ref_points.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/Addons/tsgExoticQuadrature.hpp"
                  ,0xed,
                  "TasGrid::CustomTabulated TasGrid::getShiftedExoticQuadrature(const int, const double, const std::vector<double> &, const std::vector<double> &, const char *, const bool)"
                 );
  }
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)&weights_cache.
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)local_70);
  if (is_symmetric) {
    getGaussNodesAndWeights<true>
              (n,ref_points,shifted_weights,
               (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                *)&weights_cache.
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                *)local_70);
  }
  else {
    getGaussNodesAndWeights<false>
              (n,ref_points,shifted_weights,
               (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                *)&weights_cache.
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                *)local_70);
  }
  if ((shift != 0.0) || (NAN(shift))) {
    for (init_size._0_4_ = 0; (int)init_size < n; init_size._0_4_ = (int)init_size + 1) {
      pvVar9 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             *)&weights_cache.
                                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,
                            (long)(int)init_size);
      piVar6 = (pointer)std::vector<double,_std::allocator<double>_>::size(pvVar9);
      this = &correction_weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)this);
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)&__range3);
      correction_points.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ = (int)piVar6;
      TasGrid::OneDimensionalNodes::getGaussLegendre
                ((int)correction_points.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,(vector *)&__range3,(vector *)this);
      __end3 = std::vector<double,_std::allocator<double>_>::begin
                         ((vector<double,_std::allocator<double>_> *)&__range3);
      w = (double *)
          std::vector<double,_std::allocator<double>_>::end
                    ((vector<double,_std::allocator<double>_> *)&__range3);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                                         *)&w), bVar2) {
        pdVar7 = __gnu_cxx::
                 __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
                 operator*(&__end3);
        *pdVar7 = -shift * *pdVar7;
        __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
        operator++(&__end3);
      }
      sVar4 = std::vector<double,_std::allocator<double>_>::size
                        ((vector<double,_std::allocator<double>_> *)
                         &correction_weights.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
      if (((sVar4 & 1) == 1) && (is_symmetric)) {
        sVar4 = std::vector<double,_std::allocator<double>_>::size
                          ((vector<double,_std::allocator<double>_> *)
                           &correction_weights.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
        pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)
                            &correction_weights.super__Vector_base<double,_std::allocator<double>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage,sVar4 - 1 >> 1);
        *pvVar8 = 0.0;
      }
      for (nonunique_idx = 0;
          sVar4 = std::vector<double,_std::allocator<double>_>::size
                            ((vector<double,_std::allocator<double>_> *)
                             &correction_weights.super__Vector_base<double,_std::allocator<double>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage),
          (ulong)nonunique_idx < sVar4; nonunique_idx = nonunique_idx + 1) {
        k = 0xffffffffffffffff;
        for (num_nodes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_end_of_storage = (pointer)0x0;
            num_nodes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage < piVar6;
            num_nodes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage =
                 (pointer)((long)num_nodes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage + 1)) {
          std::vector<double,_std::allocator<double>_>::operator[]
                    ((vector<double,_std::allocator<double>_> *)
                     &correction_weights.super__Vector_base<double,_std::allocator<double>_>._M_impl
                      .super__Vector_impl_data._M_end_of_storage,nonunique_idx);
          pvVar9 = std::
                   vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                 *)&weights_cache.
                                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                (long)(int)init_size);
          std::vector<double,_std::allocator<double>_>::operator[]
                    (pvVar9,(size_type)
                            num_nodes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage);
          std::abs((int)pvVar9);
          if (extraout_XMM0_Qa <= 1e-12) {
            k = (size_t)num_nodes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage;
            break;
          }
        }
        if (k == 0xffffffffffffffff) {
          pvVar9 = std::
                   vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                 *)&weights_cache.
                                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                (long)(int)init_size);
          pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)
                              &correction_weights.
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage,nonunique_idx);
          std::vector<double,_std::allocator<double>_>::push_back(pvVar9,pvVar8);
          pvVar9 = std::
                   vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                 *)local_70,(long)(int)init_size);
          pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)&__range3,nonunique_idx);
          std::vector<double,_std::allocator<double>_>::push_back(pvVar9,pvVar8);
        }
        else {
          pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)&__range3,nonunique_idx);
          dVar1 = *pvVar8;
          pvVar9 = std::
                   vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                 *)local_70,(long)(int)init_size);
          pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](pvVar9,k);
          *pvVar8 = dVar1 + *pvVar8;
        }
      }
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)&__range3);
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)
                 &correction_weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
    }
  }
  this_00 = (allocator<int> *)
            ((long)&precision.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(this_00);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_108,(long)n,this_00);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&precision.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<int>::allocator(&local_129);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&i_1,(long)n,&local_129);
  std::allocator<int>::~allocator(&local_129);
  for (local_130 = 0; local_130 < n; local_130 = local_130 + 1) {
    pvVar9 = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           *)&weights_cache.
                              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)local_130);
    sVar4 = std::vector<double,_std::allocator<double>_>::size(pvVar9);
    pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)local_108,(long)local_130);
    *pvVar10 = (value_type)sVar4;
    iVar3 = local_130 + 1;
    pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)&i_1,(long)local_130);
    *pvVar10 = iVar3 * 2 + -1;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_150,description,&local_151);
  CustomTabulated::CustomTabulated
            (__return_storage_ptr__,(vector<int,_std::allocator<int>_> *)local_108,
             (vector<int,_std::allocator<int>_> *)&i_1,
             (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              *)&weights_cache.
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              *)local_70,&local_150);
  std::__cxx11::string::~string((string *)&local_150);
  std::allocator<char>::~allocator(&local_151);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&i_1);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_108);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)local_70);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)&weights_cache.
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return __return_storage_ptr__;
}

Assistant:

inline TasGrid::CustomTabulated getShiftedExoticQuadrature(const int n, const double shift, const std::vector<double> &shifted_weights,
                                                           const std::vector<double> &ref_points, const char* description,
                                                           const bool is_symmetric = false) {
    // Create the set of points (roots) and weights for the first term.
    assert(shifted_weights.size() == ref_points.size());
    std::vector<std::vector<double>> points_cache, weights_cache;
    if (is_symmetric) {
        getGaussNodesAndWeights<true>(n, ref_points, shifted_weights, points_cache, weights_cache);
    } else {
        getGaussNodesAndWeights<false>(n, ref_points, shifted_weights, points_cache, weights_cache);
    }

    // Create and append the set of correction points and weights for the second term only if the shift is nonzero.
    if (shift != 0.0) {
        for (int i=0; i<n; i++) {
            const size_t init_size = points_cache[i].size();
            std::vector<double> correction_points, correction_weights;
            TasGrid::OneDimensionalNodes::getGaussLegendre(static_cast<int>(init_size), correction_weights, correction_points);
            for (auto &w : correction_weights) w *= -shift;
            if (correction_points.size() % 2 == 1 && is_symmetric) {
                // Zero out for stability.
                correction_points[(correction_points.size() - 1) / 2] = 0.0;
            }
            // Account for duplicates up to a certain tolerance.
            for (size_t j=0; j<correction_points.size(); j++) {
                long long nonunique_idx = -1;
                for (size_t k=0; k<init_size; k++) {
                    if (std::abs(correction_points[j] - points_cache[i][k]) <= Maths::num_tol) {
                        nonunique_idx = static_cast<long long>(k);
                        break;
                    }
                }
                if (nonunique_idx == -1) {
                    points_cache[i].push_back(correction_points[j]);
                    weights_cache[i].push_back(correction_weights[j]);
                } else {
                    weights_cache[i][nonunique_idx] += correction_weights[j];
                }
            }
        }
    }

    // Output to a CustomTabulated instance.
    std::vector<int> num_nodes(n), precision(n);
    for (int i=0; i<n; i++) {
        num_nodes[i] = static_cast<int>(points_cache[i].size());
        precision[i] = 2 * (i + 1) - 1;
    }
    return TasGrid::CustomTabulated(std::move(num_nodes), std::move(precision), std::move(points_cache), std::move(weights_cache),
                                    description);
}